

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O2

void __thiscall Fl_File_Chooser::favoritesCB(Fl_File_Chooser *this,Fl_Widget *w)

{
  Fl_Preferences *this_00;
  char *pcVar1;
  Fl_File_Icon *d;
  fd_set *pfVar2;
  fd_set *in_RCX;
  uint uVar3;
  int iVar4;
  Fl_File_Browser *pFVar5;
  Fl_Button *pFVar6;
  fd_set *in_R8;
  timeval *in_R9;
  char name [32];
  char pathname [1024];
  
  pFVar5 = this->favList;
  if (w == (Fl_Widget *)0x0) {
    Fl_Browser::clear(&pFVar5->super_Fl_Browser);
    Fl_Browser_::deselect((Fl_Browser_ *)this->favList,0);
    for (uVar3 = 0; uVar3 != 100; uVar3 = uVar3 + 1) {
      sprintf(name,"favorite%02d",(ulong)uVar3);
      Fl_Preferences::get(prefs_,name,pathname,"",0x400);
      if (pathname[0] == '\0') break;
      pFVar5 = this->favList;
      d = Fl_File_Icon::find(pathname,5);
      Fl_Browser::add(&pFVar5->super_Fl_Browser,pathname,d);
    }
    Fl_Widget::deactivate(&this->favUpButton->super_Fl_Widget);
    Fl_Widget::deactivate(&this->favDeleteButton->super_Fl_Widget);
    Fl_Widget::deactivate(&this->favDownButton->super_Fl_Widget);
    Fl_Widget::deactivate((Fl_Widget *)this->favOkButton);
    Fl_Window::hotspot(&this->favWindow->super_Fl_Window,(Fl_Widget *)this->favList,0);
    (*(this->favWindow->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
    return;
  }
  if (pFVar5 == (Fl_File_Browser *)w) {
    iVar4 = Fl_Browser::value(&pFVar5->super_Fl_Browser);
    if (iVar4 == 0) {
      Fl_Widget::deactivate(&this->favUpButton->super_Fl_Widget);
      Fl_Widget::deactivate(&this->favDeleteButton->super_Fl_Widget);
      pFVar6 = this->favDownButton;
LAB_001f9057:
      Fl_Widget::deactivate(&pFVar6->super_Fl_Widget);
      return;
    }
    if (iVar4 < 2) {
      Fl_Widget::deactivate(&this->favUpButton->super_Fl_Widget);
    }
    else {
      Fl_Widget::activate(&this->favUpButton->super_Fl_Widget);
    }
    Fl_Widget::activate(&this->favDeleteButton->super_Fl_Widget);
    pFVar6 = this->favDownButton;
    if ((this->favList->super_Fl_Browser).lines <= iVar4) goto LAB_001f9057;
    goto LAB_001f910b;
  }
  if (this->favUpButton == (Fl_Button *)w) {
    iVar4 = Fl_Browser::value(&pFVar5->super_Fl_Browser);
    pFVar5 = this->favList;
    pcVar1 = Fl_Browser::text(&pFVar5->super_Fl_Browser,iVar4);
    pfVar2 = (fd_set *)Fl_Browser::data(&this->favList->super_Fl_Browser,iVar4);
    Fl_Browser::insert(&pFVar5->super_Fl_Browser,iVar4 + -1,pcVar1,pfVar2);
    Fl_Browser::remove(&this->favList->super_Fl_Browser,(char *)(ulong)(iVar4 + 1));
    Fl_Browser::select(&this->favList->super_Fl_Browser,iVar4 + -1,(fd_set *)&DAT_00000001,pfVar2,
                       in_R8,in_R9);
    if (iVar4 == 2) {
      Fl_Widget::deactivate(&this->favUpButton->super_Fl_Widget);
    }
    pFVar6 = this->favDownButton;
LAB_001f90ff:
    Fl_Widget::activate(&pFVar6->super_Fl_Widget);
  }
  else {
    if (this->favDeleteButton != (Fl_Button *)w) {
      if (this->favDownButton != (Fl_Button *)w) {
        if ((Fl_Widget *)this->favOkButton != w) {
          return;
        }
        uVar3 = 0;
        while ((int)uVar3 < (pFVar5->super_Fl_Browser).lines) {
          sprintf(name,"favorite%02d",(ulong)uVar3);
          this_00 = prefs_;
          uVar3 = uVar3 + 1;
          pcVar1 = Fl_Browser::text(&this->favList->super_Fl_Browser,uVar3);
          Fl_Preferences::set(this_00,name,pcVar1);
          pFVar5 = this->favList;
        }
        for (; uVar3 < 100; uVar3 = uVar3 + 1) {
          sprintf(name,"favorite%02d",(ulong)uVar3);
          Fl_Preferences::get(prefs_,name,pathname,"",0x400);
          if (pathname[0] == '\0') break;
          Fl_Preferences::set(prefs_,name,"");
        }
        update_favorites(this);
        Fl_Preferences::flush(prefs_);
        (*(this->favWindow->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[6])();
        return;
      }
      uVar3 = Fl_Browser::value(&pFVar5->super_Fl_Browser);
      pFVar5 = this->favList;
      pcVar1 = Fl_Browser::text(&pFVar5->super_Fl_Browser,uVar3);
      pfVar2 = (fd_set *)Fl_Browser::data(&this->favList->super_Fl_Browser,uVar3);
      Fl_Browser::insert(&pFVar5->super_Fl_Browser,uVar3 + 2,pcVar1,pfVar2);
      Fl_Browser::remove(&this->favList->super_Fl_Browser,(char *)(ulong)uVar3);
      Fl_Browser::select(&this->favList->super_Fl_Browser,uVar3 + 1,(fd_set *)&DAT_00000001,pfVar2,
                         in_R8,in_R9);
      if (uVar3 + 1 == (this->favList->super_Fl_Browser).lines) {
        Fl_Widget::deactivate(&this->favDownButton->super_Fl_Widget);
      }
      pFVar6 = this->favUpButton;
      goto LAB_001f90ff;
    }
    uVar3 = Fl_Browser::value(&pFVar5->super_Fl_Browser);
    Fl_Browser::remove(&this->favList->super_Fl_Browser,(char *)(ulong)uVar3);
    iVar4 = uVar3 - ((this->favList->super_Fl_Browser).lines < (int)uVar3);
    Fl_Browser::select(&this->favList->super_Fl_Browser,iVar4,(fd_set *)&DAT_00000001,in_RCX,in_R8,
                       in_R9);
    if (iVar4 < (this->favList->super_Fl_Browser).lines) {
      Fl_Widget::activate(&this->favDownButton->super_Fl_Widget);
    }
    else {
      Fl_Widget::deactivate(&this->favDownButton->super_Fl_Widget);
    }
    pFVar6 = this->favUpButton;
    if (1 < iVar4) goto LAB_001f90ff;
    Fl_Widget::deactivate(&pFVar6->super_Fl_Widget);
    if (iVar4 == 0) {
      Fl_Widget::deactivate(&this->favDeleteButton->super_Fl_Widget);
    }
  }
  pFVar6 = &this->favOkButton->super_Fl_Button;
LAB_001f910b:
  Fl_Widget::activate(&pFVar6->super_Fl_Widget);
  return;
}

Assistant:

void
Fl_File_Chooser::favoritesCB(Fl_Widget *w)
					// I - Widget
{
  int		i;			// Looping var
  char		name[32],		// Preference name
		pathname[1024];		// Directory in list


  if (!w) {
    // Load the favorites list...
    favList->clear();
    favList->deselect();

    for (i = 0; i < 100; i ++) {
      // Get favorite directory 0 to 99...
      sprintf(name, "favorite%02d", i);

      prefs_->get(name, pathname, "", sizeof(pathname));

      // Stop on the first empty favorite...
      if (!pathname[0]) break;

      // Add the favorite to the list...
      favList->add(pathname,
                   Fl_File_Icon::find(pathname, Fl_File_Icon::DIRECTORY));
    }

    favUpButton->deactivate();
    favDeleteButton->deactivate();
    favDownButton->deactivate();
    favOkButton->deactivate();

    favWindow->hotspot(favList);
    favWindow->show();
  } else if (w == favList) {
    i = favList->value();
    if (i) {
      if (i > 1) favUpButton->activate();
      else favUpButton->deactivate();

      favDeleteButton->activate();

      if (i < favList->size()) favDownButton->activate();
      else favDownButton->deactivate();
    } else {
      favUpButton->deactivate();
      favDeleteButton->deactivate();
      favDownButton->deactivate();
    }
  } else if (w == favUpButton) {
    i = favList->value();

    favList->insert(i - 1, favList->text(i), favList->data(i));
    favList->remove(i + 1);
    favList->select(i - 1);

    if (i == 2) favUpButton->deactivate();

    favDownButton->activate();

    favOkButton->activate();
  } else if (w == favDeleteButton) {
    i = favList->value();

    favList->remove(i);

    if (i > favList->size()) i --;
    favList->select(i);

    if (i < favList->size()) favDownButton->activate();
    else favDownButton->deactivate();

    if (i > 1) favUpButton->activate();
    else favUpButton->deactivate();

    if (!i) favDeleteButton->deactivate();

    favOkButton->activate();
  } else if (w == favDownButton) {
    i = favList->value();

    favList->insert(i + 2, favList->text(i), favList->data(i));
    favList->remove(i);
    favList->select(i + 1);

    if ((i + 1) == favList->size()) favDownButton->deactivate();

    favUpButton->activate();

    favOkButton->activate();
  } else if (w == favOkButton) {
    // Copy the new list over...
    for (i = 0; i < favList->size(); i ++) {
      // Set favorite directory 0 to 99...
      sprintf(name, "favorite%02d", i);

      prefs_->set(name, favList->text(i + 1));
    }

    // Clear old entries as necessary...
    for (; i < 100; i ++) {
      // Clear favorite directory 0 to 99...
      sprintf(name, "favorite%02d", i);

      prefs_->get(name, pathname, "", sizeof(pathname));

      if (pathname[0]) prefs_->set(name, "");
      else break;
    }

    update_favorites();
    prefs_->flush();

    favWindow->hide();
  }
}